

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

VkResult __thiscall
Diligent::CommandQueueVkImpl::Present(CommandQueueVkImpl *this,VkPresentInfoKHR *PresentInfo)

{
  VkResult VVar1;
  
  std::mutex::lock(&this->m_QueueMutex);
  VVar1 = (*vkQueuePresentKHR)(this->m_VkQueue,PresentInfo);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
  return VVar1;
}

Assistant:

VkResult CommandQueueVkImpl::Present(const VkPresentInfoKHR& PresentInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};
    return vkQueuePresentKHR(m_VkQueue, &PresentInfo);
}